

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O0

void phosg::parallel_range_thread_fn<unsigned_long>
               (function<bool_(unsigned_long,_unsigned_long)> *fn,
               atomic<unsigned_long> *current_value,atomic<unsigned_long> *result_value,
               unsigned_long end_value,size_t thread_num)

{
  ulong __args;
  bool bVar1;
  unsigned_long v;
  size_t thread_num_local;
  unsigned_long end_value_local;
  atomic<unsigned_long> *result_value_local;
  atomic<unsigned_long> *current_value_local;
  function<bool_(unsigned_long,_unsigned_long)> *fn_local;
  
  while( true ) {
    LOCK();
    __args = (current_value->super___atomic_base<unsigned_long>)._M_i;
    (current_value->super___atomic_base<unsigned_long>)._M_i =
         (current_value->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (end_value <= __args) break;
    bVar1 = ::std::function<bool_(unsigned_long,_unsigned_long)>::operator()(fn,__args,thread_num);
    if (bVar1) {
      ::std::__atomic_base<unsigned_long>::operator=
                (&result_value->super___atomic_base<unsigned_long>,__args);
      ::std::__atomic_base<unsigned_long>::operator=
                (&current_value->super___atomic_base<unsigned_long>,end_value);
    }
  }
  return;
}

Assistant:

void parallel_range_thread_fn(
    std::function<bool(IntT, size_t thread_num)>& fn,
    std::atomic<IntT>& current_value,
    std::atomic<IntT>& result_value,
    IntT end_value,
    size_t thread_num) {
  IntT v;
  while ((v = current_value.fetch_add(1)) < end_value) {
    if (fn(v, thread_num)) {
      result_value = v;
      current_value = end_value;
    }
  }
}